

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableSetupScrollFreeze(int columns,int rows)

{
  float fVar1;
  ImGuiTable *pIVar2;
  ImGuiTableColumnIdx IVar3;
  ImGuiTable *table;
  ImGuiContext *g;
  int rows_local;
  int columns_local;
  
  pIVar2 = GImGui->CurrentTable;
  if ((pIVar2->Flags & 0x1000000U) == 0) {
    IVar3 = '\0';
  }
  else {
    IVar3 = (ImGuiTableColumnIdx)columns;
  }
  pIVar2->FreezeColumnsRequest = IVar3;
  fVar1 = (pIVar2->InnerWindow->Scroll).x;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    IVar3 = pIVar2->FreezeColumnsRequest;
  }
  else {
    IVar3 = '\0';
  }
  pIVar2->FreezeColumnsCount = IVar3;
  if ((pIVar2->Flags & 0x2000000U) == 0) {
    IVar3 = '\0';
  }
  else {
    IVar3 = (ImGuiTableColumnIdx)rows;
  }
  pIVar2->FreezeRowsRequest = IVar3;
  fVar1 = (pIVar2->InnerWindow->Scroll).y;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    IVar3 = pIVar2->FreezeRowsRequest;
  }
  else {
    IVar3 = '\0';
  }
  pIVar2->FreezeRowsCount = IVar3;
  pIVar2->IsUnfrozenRows = pIVar2->FreezeRowsCount == '\0';
  return;
}

Assistant:

void ImGui::TableSetupScrollFreeze(int columns, int rows)
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    IM_ASSERT(table != NULL && "Need to call TableSetupColumn() after BeginTable()!");
    IM_ASSERT(table->IsLayoutLocked == false && "Need to call TableSetupColumn() before first row!");
    IM_ASSERT(columns >= 0 && columns < IMGUI_TABLE_MAX_COLUMNS);
    IM_ASSERT(rows >= 0 && rows < 128); // Arbitrary limit

    table->FreezeColumnsRequest = (table->Flags & ImGuiTableFlags_ScrollX) ? (ImGuiTableColumnIdx)columns : 0;
    table->FreezeColumnsCount = (table->InnerWindow->Scroll.x != 0.0f) ? table->FreezeColumnsRequest : 0;
    table->FreezeRowsRequest = (table->Flags & ImGuiTableFlags_ScrollY) ? (ImGuiTableColumnIdx)rows : 0;
    table->FreezeRowsCount = (table->InnerWindow->Scroll.y != 0.0f) ? table->FreezeRowsRequest : 0;
    table->IsUnfrozenRows = (table->FreezeRowsCount == 0); // Make sure this is set before TableUpdateLayout() so ImGuiListClipper can benefit from it.b
}